

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gms_matcher.h
# Opt level: O0

int __thiscall
gms_matcher::GetInlierMask
          (gms_matcher *this,vector<bool,_std::allocator<bool>_> *vbInliers,bool WithScale,
          bool WithRotation)

{
  int iVar1;
  int local_40;
  int num_inlier_2;
  int Scale_1;
  int num_inlier_1;
  int RotationType_1;
  int num_inlier;
  int RotationType;
  int Scale;
  int max_inlier;
  bool WithRotation_local;
  bool WithScale_local;
  vector<bool,_std::allocator<bool>_> *vbInliers_local;
  gms_matcher *this_local;
  
  RotationType = 0;
  if ((WithScale) || (WithRotation)) {
    if ((WithRotation) && (WithScale)) {
      for (num_inlier = 0; num_inlier < 5; num_inlier = num_inlier + 1) {
        SetScale(this,num_inlier);
        for (RotationType_1 = 1; RotationType_1 < 9; RotationType_1 = RotationType_1 + 1) {
          iVar1 = run(this,RotationType_1);
          if (RotationType < iVar1) {
            std::vector<bool,_std::allocator<bool>_>::operator=(vbInliers,&this->mvbInlierMask);
            RotationType = iVar1;
          }
        }
      }
      this_local._4_4_ = RotationType;
    }
    else if ((!WithRotation) || (WithScale)) {
      if ((WithRotation) || (!WithScale)) {
        this_local._4_4_ = 0;
      }
      else {
        for (local_40 = 0; local_40 < 5; local_40 = local_40 + 1) {
          SetScale(this,local_40);
          iVar1 = run(this,1);
          if (RotationType < iVar1) {
            std::vector<bool,_std::allocator<bool>_>::operator=(vbInliers,&this->mvbInlierMask);
            RotationType = iVar1;
          }
        }
        this_local._4_4_ = RotationType;
      }
    }
    else {
      SetScale(this,0);
      for (Scale_1 = 1; Scale_1 < 9; Scale_1 = Scale_1 + 1) {
        iVar1 = run(this,Scale_1);
        if (RotationType < iVar1) {
          std::vector<bool,_std::allocator<bool>_>::operator=(vbInliers,&this->mvbInlierMask);
          RotationType = iVar1;
        }
      }
      this_local._4_4_ = RotationType;
    }
  }
  else {
    SetScale(this,0);
    this_local._4_4_ = run(this,1);
    std::vector<bool,_std::allocator<bool>_>::operator=(vbInliers,&this->mvbInlierMask);
  }
  return this_local._4_4_;
}

Assistant:

int gms_matcher::GetInlierMask(vector<bool> &vbInliers, bool WithScale, bool WithRotation) {

	int max_inlier = 0;

	if (!WithScale && !WithRotation)
	{
		SetScale(0);
		max_inlier = run(1);
		vbInliers = mvbInlierMask;
		return max_inlier;
	}

	if (WithRotation && WithScale)
	{
		for (int Scale = 0; Scale < 5; Scale++)
		{
			SetScale(Scale);
			for (int RotationType = 1; RotationType <= 8; RotationType++)
			{
				int num_inlier = run(RotationType);

				if (num_inlier > max_inlier)
				{
					vbInliers = mvbInlierMask;
					max_inlier = num_inlier;
				}
			}
		}
		return max_inlier;
	}

	if (WithRotation && !WithScale)
	{
		SetScale(0);
		for (int RotationType = 1; RotationType <= 8; RotationType++)
		{
			int num_inlier = run(RotationType);

			if (num_inlier > max_inlier)
			{
				vbInliers = mvbInlierMask;
				max_inlier = num_inlier;
			}
		}
		return max_inlier;
	}

	if (!WithRotation && WithScale)
	{
		for (int Scale = 0; Scale < 5; Scale++)
		{
			SetScale(Scale);

			int num_inlier = run(1);

			if (num_inlier > max_inlier)
			{
				vbInliers = mvbInlierMask;
				max_inlier = num_inlier;
			}
			
		}
		return max_inlier;
	}

	return max_inlier;
}